

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_encoder.cc
# Opt level: O2

bool __thiscall draco::PointCloudEncoder::GenerateAttributesEncoders(PointCloudEncoder *this)

{
  pointer puVar1;
  pointer puVar2;
  __uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_> _Var3;
  long lVar4;
  long lVar5;
  pointer piVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  uint32_t i;
  uint uVar10;
  uint32_t j;
  int iVar11;
  
  uVar9 = 0;
  while( true ) {
    iVar8 = (int)uVar9;
    iVar11 = (int)((ulong)((long)(this->point_cloud_->attributes_).
                                 super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->point_cloud_->attributes_).
                                super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
    if (iVar11 <= iVar8) break;
    iVar7 = (*this->_vptr_PointCloudEncoder[9])(this,uVar9);
    uVar9 = (ulong)(iVar8 + 1);
    if ((char)iVar7 == '\0') goto LAB_0013b676;
  }
  std::vector<int,_std::allocator<int>_>::resize(&this->attribute_to_encoder_map_,(long)iVar11);
  puVar1 = (this->attributes_encoders_).
           super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->attributes_encoders_).
           super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (uVar10 = 0; (ulong)uVar10 < (ulong)((long)puVar2 - (long)puVar1 >> 3); uVar10 = uVar10 + 1) {
    _Var3._M_t.
    super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
    .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl =
         puVar1[uVar10]._M_t.
         super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
         ._M_t;
    lVar4 = *(long *)((long)_Var3._M_t.
                            super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                            .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl +
                     8);
    lVar5 = *(long *)((long)_Var3._M_t.
                            super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                            .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl +
                     0x10);
    piVar6 = (this->attribute_to_encoder_map_).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_start;
    for (iVar7 = 0; (int)((ulong)(lVar5 - lVar4) >> 2) != iVar7; iVar7 = iVar7 + 1) {
      piVar6[*(int *)(lVar4 + (long)iVar7 * 4)] = uVar10;
    }
  }
LAB_0013b676:
  return iVar11 <= iVar8;
}

Assistant:

bool PointCloudEncoder::GenerateAttributesEncoders() {
  for (int i = 0; i < point_cloud_->num_attributes(); ++i) {
    if (!GenerateAttributesEncoder(i)) {
      return false;
    }
  }
  attribute_to_encoder_map_.resize(point_cloud_->num_attributes());
  for (uint32_t i = 0; i < attributes_encoders_.size(); ++i) {
    for (uint32_t j = 0; j < attributes_encoders_[i]->num_attributes(); ++j) {
      attribute_to_encoder_map_[attributes_encoders_[i]->GetAttributeId(j)] = i;
    }
  }
  return true;
}